

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O2

int __thiscall
curlpp::FormParts::File::clone
          (File *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  File *this_00;
  
  this_00 = (File *)operator_new(0x68);
  File(this_00,this);
  return (int)this_00;
}

Assistant:

curlpp::FormParts::File *
curlpp::FormParts::File::clone() const
{
   return new curlpp::FormParts::File(* this);
}